

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O2

void serialization::
     unserialize_unpack<char_const*const*&,serialization::json_iarchive,std::__cxx11::string,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>&,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&>
               (char ***arg,json_iarchive *ar,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *front,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
                      *next,
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *next_1)

{
  char *key;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  string local_50;
  
  key = **arg;
  bVar1 = json_iarchive::load_key_start_optional(ar,key);
  if (bVar1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    json_iarchive::load(ar,&local_50);
    std::optional<std::__cxx11::string>::emplace<std::__cxx11::string>
              ((optional<std::__cxx11::string> *)front,&local_50);
    json_iarchive::load_key_end(ar,key);
    std::__cxx11::string::~string((string *)&local_50);
  }
  *arg = *arg + 1;
  unserialize_unpack<char_const*const*&,serialization::json_iarchive,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>&,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&>
            (arg,ar,next,next_1);
  return;
}

Assistant:

inline void unserialize_unpack(Argument && arg, const Archive & ar, std::optional<T> & front, Args&& ... next)
{
    serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;

    if(ar.load_key_start_optional(key))
    {
        T tmp;
        unserialize_helper(ar, tmp);
        front.emplace(std::move(tmp));
        ar.load_key_end(key);
    }

    unserialize_unpack(++arg, ar, std::forward<Args>(next)...);
}